

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

uint __thiscall
Js::FunctionBody::GetLoopProfileThreshold(FunctionBody *this,uint loopInterpreterLimit)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  bVar1 = DoInterpreterProfile(this);
  if (bVar1) {
    bVar1 = DoInterpreterAutoProfile(this);
    uVar3 = 0;
    if ((bVar1) &&
       (uVar2 = (DAT_01441e6c ^ 1) * 9 + 0x10, uVar3 = loopInterpreterLimit - uVar2,
       loopInterpreterLimit < uVar2)) {
      uVar3 = 0;
    }
  }
  else {
    uVar3 = 0xffffffff;
  }
  return uVar3;
}

Assistant:

uint FunctionBody::GetLoopProfileThreshold(const uint loopInterpreterLimit) const
    {
        return
            DoInterpreterProfile()
                ? DoInterpreterAutoProfile()
                    ? loopInterpreterLimit - GetMinLoopProfileIterations(loopInterpreterLimit)
                    : 0
                : static_cast<uint>(-1);
    }